

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O1

void __thiscall
rsg::AssignStatement::AssignStatement
          (AssignStatement *this,GeneratorState *state,Variable *variable,
          ConstValueRangeAccess valueRange)

{
  Expression *pEVar1;
  ExpressionGenerator generator;
  ExpressionGenerator local_a8;
  ValueRange local_88;
  
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__AssignStatement_0018ca20;
  this->m_variable = variable;
  this->m_valueExpr = (Expression *)0x0;
  ExpressionGenerator::ExpressionGenerator(&local_a8,state);
  ValueRange::ValueRange(&local_88,valueRange);
  pEVar1 = ExpressionGenerator::generate(&local_a8,&local_88,1);
  this->m_valueExpr = pEVar1;
  ValueRange::~ValueRange(&local_88);
  ExpressionGenerator::~ExpressionGenerator(&local_a8);
  return;
}

Assistant:

AssignStatement::AssignStatement (GeneratorState& state, const Variable* variable, ConstValueRangeAccess valueRange)
	: m_variable	(variable)
	, m_valueExpr	(DE_NULL)
{
	// Generate random value
	ExpressionGenerator generator(state);
	m_valueExpr = generator.generate(valueRange, 1);
}